

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkFromDarChoices(Abc_Ntk_t *pNtkOld,Aig_Man_t *pMan)

{
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  ulong uVar8;
  Abc_Obj_t *p1;
  Abc_Ntk_t *pAVar9;
  
  if (pMan->pEquivs == (Aig_Obj_t **)0x0) {
    __assert_fail("pMan->pEquivs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x460,"Abc_Ntk_t *Abc_NtkFromDarChoices(Abc_Ntk_t *, Aig_Man_t *)");
  }
  if (pMan->nObjs[4] != 0) {
    __assert_fail("Aig_ManBufNum(pMan) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x461,"Abc_Ntk_t *Abc_NtkFromDarChoices(Abc_Ntk_t *, Aig_Man_t *)");
  }
  pNtk = Abc_NtkStartFrom(pNtkOld,ABC_NTK_STRASH,ABC_FUNC_AIG);
  pNtk->nConstrs = pMan->nConstrs;
  pNtk->nBarBufs = pNtkOld->nBarBufs;
  Aig_ManCleanData(pMan);
  pAVar4 = Abc_AigConst1(pNtk);
  (pMan->pConst1->field_5).pData = pAVar4;
  pVVar6 = pMan->vCis;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      if (pNtk->vCis->nSize <= lVar5) goto LAB_0024a90f;
      *(void **)((long)pVVar6->pArray[lVar5] + 0x28) = pNtk->vCis->pArray[lVar5];
      lVar5 = lVar5 + 1;
      pVVar6 = pMan->vCis;
    } while (lVar5 < pVVar6->nSize);
  }
  pVVar6 = pMan->vObjs;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar5];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_0024a92e;
        uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar4 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        uVar7 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          p1 = (Abc_Obj_t *)0x0;
        }
        else {
          p1 = (Abc_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        pAVar4 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,pAVar4,p1);
        *(Abc_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
        if ((pMan->pEquivs != (Aig_Obj_t **)0x0) &&
           (pAVar2 = pMan->pEquivs[*(int *)((long)pvVar1 + 0x24)], pAVar2 != (Aig_Obj_t *)0x0)) {
          pvVar1 = (pAVar2->field_5).pData;
          if (pvVar1 == (void *)0x0) {
            __assert_fail("pTemp->pData != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                          ,0x471,"Abc_Ntk_t *Abc_NtkFromDarChoices(Abc_Ntk_t *, Aig_Man_t *)");
          }
          (pAVar4->field_5).pData = pvVar1;
        }
      }
      lVar5 = lVar5 + 1;
      pVVar6 = pMan->vObjs;
    } while (lVar5 < pVVar6->nSize);
  }
  pVVar6 = pMan->vCos;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      if (pNtk->vCos->nSize <= lVar5) {
LAB_0024a90f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (((ulong)pVVar6->pArray[lVar5] & 1) != 0) {
LAB_0024a92e:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar7 = *(ulong *)((long)pVVar6->pArray[lVar5] + 8);
      uVar8 = uVar7 & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        pAVar4 = (Abc_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Abc_Obj_t *)((ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar8 + 0x28));
      }
      Abc_ObjAddFanin((Abc_Obj_t *)pNtk->vCos->pArray[lVar5],pAVar4);
      lVar5 = lVar5 + 1;
      pVVar6 = pMan->vCos;
    } while (lVar5 < pVVar6->nSize);
  }
  pAVar9 = pNtk;
  iVar3 = Abc_NtkCheck(pNtk);
  if (iVar3 == 0) {
    Abc_Print((int)pAVar9,"Abc_NtkFromDar(): Network check has failed.\n");
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromDarChoices( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan )
{
    Abc_Ntk_t * pNtkNew;
    Aig_Obj_t * pObj, * pTemp;
    int i;
    assert( pMan->pEquivs != NULL );
    assert( Aig_ManBufNum(pMan) == 0 );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtkOld, ABC_NTK_STRASH, ABC_FUNC_AIG );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pNtkOld->nBarBufs;
    // transfer the pointers to the basic nodes
    Aig_ManCleanData( pMan );
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pData = Abc_NtkCi(pNtkNew, i);
    // rebuild the AIG
    Aig_ManForEachNode( pMan, pObj, i )
    {
        pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
        if ( (pTemp = Aig_ObjEquiv(pMan, pObj)) )
        {
            assert( pTemp->pData != NULL );
            ((Abc_Obj_t *)pObj->pData)->pData = ((Abc_Obj_t *)pTemp->pData);
        }
    }
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), (Abc_Obj_t *)Aig_ObjChild0Copy(pObj) );
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromDar(): Network check has failed.\n" );

    // verify topological order
    if ( 0 )
    {
        Abc_Obj_t * pNode;
        Abc_NtkForEachNode( pNtkNew, pNode, i )
            if ( Abc_AigNodeIsChoice( pNode ) )
            {
                int Counter = 0;
                for ( pNode = Abc_ObjEquiv(pNode); pNode; pNode = Abc_ObjEquiv(pNode) )
                    Counter++;
                printf( "%d ", Counter );
            }
        printf( "\n" );
    }
    return pNtkNew;
}